

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

double __thiscall
ON_SurfaceCurvature::KappaValue(ON_SurfaceCurvature *this,curvature_style kappa_style)

{
  double local_20;
  double k;
  curvature_style kappa_style_local;
  ON_SurfaceCurvature *this_local;
  
  switch(kappa_style) {
  case gaussian_curvature:
    local_20 = GaussianCurvature(this);
    break;
  case mean_curvature:
    local_20 = MeanCurvature(this);
    local_20 = ABS(local_20);
    break;
  case min_curvature:
    local_20 = MinimumRadius(this);
    break;
  case max_curvature:
    local_20 = MaximumRadius(this);
    break;
  default:
    local_20 = ON_DBL_QNAN;
  }
  return local_20;
}

Assistant:

double ON_SurfaceCurvature::KappaValue(ON::curvature_style kappa_style) const
{
  double k;
  switch (kappa_style)
  {
  case ON::gaussian_curvature:
    k = this->GaussianCurvature();
    break;

  case ON::mean_curvature:
    // fabs() is correct here.
    // Turns out the vast majority of users don't appear to care about 
    // signed mean curvature and find it confusing.
    k = fabs(this->MeanCurvature());
    break;

  case ON::min_curvature:
    k = this->MinimumRadius();
    break;

  case ON::max_curvature:
    k = this->MaximumRadius();
    break;

  default:
    k = ON_DBL_QNAN;
    break;
  }
  return k;
}